

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3813::Basis_M
          (ChElementHexaANCF_3813 *this,ChMatrixNM<double,_6,_9> *M,double x,double y,double z)

{
  Eigen::DenseBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_> *)M);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>).m_storage.m_data.array[0] = x;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>).m_storage.m_data.array[10] = y;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>).m_storage.m_data.array[0x14] = x
  ;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>).m_storage.m_data.array[0x15] = y
  ;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>).m_storage.m_data.array[0x1f] = z
  ;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>).m_storage.m_data.array[0x29] = x
  ;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>).m_storage.m_data.array[0x2a] = z
  ;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>).m_storage.m_data.array[0x34] = y
  ;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_6,_9,_1,_6,_9>_>).m_storage.m_data.array[0x35] = z
  ;
  return;
}

Assistant:

void ChElementHexaANCF_3813::Basis_M(ChMatrixNM<double, 6, 9>& M, double x, double y, double z) {
    M.setZero();
    M(0, 0) = x;
    M(1, 1) = y;
    M(2, 2) = x;
    M(2, 3) = y;
    M(3, 4) = z;
    M(4, 5) = x;
    M(4, 6) = z;
    M(5, 7) = y;
    M(5, 8) = z;
}